

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O2

void compute_gradient_info_sb(MACROBLOCK *x,BLOCK_SIZE sb_size,PLANE_TYPE plane)

{
  buf_2d *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  undefined1 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  undefined7 in_register_00000011;
  ulong uVar15;
  uint8_t *puVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  long lVar24;
  int c;
  long lVar25;
  long lVar26;
  
  uVar13 = CONCAT71(in_register_00000011,plane) & 0xffffffff;
  uVar15 = (ulong)(uint)((int)CONCAT71(in_register_00000011,plane) << 0x10);
  pbVar1 = &x->plane[uVar13].src;
  puVar23 = pbVar1->buf;
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    iVar7 = (x->e_mbd).plane[uVar13].subsampling_y;
    bVar2 = block_size_high[sb_size];
    bVar6 = block_size_wide[sb_size] >> ((byte)(x->e_mbd).plane[uVar13].subsampling_x & 0x1f);
    lVar20 = (long)pbVar1->stride;
    lVar17 = (long)&x->pixel_gradient_info[(ulong)bVar6 + 1].abs_dx_abs_dy_sum + uVar15;
    puVar22 = puVar23 + lVar20 * 2;
    puVar16 = puVar23;
    for (lVar11 = 1; puVar23 = puVar23 + lVar20, lVar11 < (int)((bVar2 >> ((byte)iVar7 & 0x1f)) - 1)
        ; lVar11 = lVar11 + 1) {
      for (lVar25 = 1; lVar25 < (int)(bVar6 - 1); lVar25 = lVar25 + 1) {
        iVar19 = (uint)puVar16[lVar25 + 1] + (uint)puVar23[lVar25 + 1] * 2 +
                 (uint)puVar22[lVar25 + 1];
        iVar12 = (uint)puVar16[lVar25 + -1] + (uint)puVar23[lVar25 + -1] * 2 +
                 (uint)puVar22[lVar25 + -1];
        iVar10 = (((uint)puVar22[lVar25 + 1] + (uint)puVar22[lVar25 + -1]) -
                 ((uint)puVar16[lVar25 + -1] + (uint)puVar16[lVar25 + 1])) +
                 ((uint)puVar22[lVar25] - (uint)puVar16[lVar25]) * 2;
        iVar9 = iVar19 - iVar12;
        iVar5 = -iVar9;
        if (0 < iVar9) {
          iVar5 = iVar9;
        }
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        uVar8 = 0xff;
        iVar19 = iVar19 - iVar12;
        *(bool *)(lVar17 + -1 + lVar25 * 4) = iVar19 == 0;
        *(short *)(lVar17 + -4 + lVar25 * 4) = (short)iVar9 + (short)iVar5;
        if (iVar19 != 0) {
          iVar10 = get_hist_bin_idx(iVar19,iVar10);
          uVar8 = (undefined1)iVar10;
        }
        *(undefined1 *)(lVar17 + -2 + lVar25 * 4) = uVar8;
      }
      lVar17 = lVar17 + (ulong)bVar6 * 4;
      puVar22 = puVar22 + lVar20;
      puVar16 = puVar16 + lVar20;
    }
  }
  else {
    lVar24 = (long)puVar23 * 2;
    iVar7 = (x->e_mbd).plane[uVar13].subsampling_y;
    bVar2 = block_size_high[sb_size];
    bVar6 = block_size_wide[sb_size] >> ((byte)(x->e_mbd).plane[uVar13].subsampling_x & 0x1f);
    lVar18 = (long)&x->pixel_gradient_info[(ulong)bVar6 + 1].abs_dx_abs_dy_sum + uVar15;
    lVar17 = (long)pbVar1->stride * 4 + (long)puVar23 * 2;
    lVar25 = (long)pbVar1->stride * 2;
    lVar11 = (long)puVar23 * 2;
    for (lVar20 = 1; lVar11 = lVar25 + lVar11, lVar20 < (int)((bVar2 >> ((byte)iVar7 & 0x1f)) - 1);
        lVar20 = lVar20 + 1) {
      for (lVar26 = 1; lVar26 < (int)(bVar6 - 1); lVar26 = lVar26 + 1) {
        uVar3 = *(ushort *)(lVar24 + 2 + lVar26 * 2);
        uVar14 = (uint)*(ushort *)(lVar17 + 2 + lVar26 * 2);
        iVar19 = (uint)uVar3 + (uint)*(ushort *)(lVar11 + 2 + lVar26 * 2) * 2 + uVar14;
        uVar4 = *(ushort *)(lVar24 + -2 + lVar26 * 2);
        uVar21 = (uint)*(ushort *)(lVar17 + -2 + lVar26 * 2);
        iVar12 = (uint)uVar4 + (uint)*(ushort *)(lVar11 + -2 + lVar26 * 2) * 2 + uVar21;
        iVar10 = ((uVar14 + uVar21) - ((uint)uVar4 + (uint)uVar3)) +
                 ((uint)*(ushort *)(lVar17 + lVar26 * 2) - (uint)*(ushort *)(lVar24 + lVar26 * 2)) *
                 2;
        iVar9 = iVar19 - iVar12;
        iVar5 = -iVar9;
        if (0 < iVar9) {
          iVar5 = iVar9;
        }
        iVar9 = -iVar10;
        if (0 < iVar10) {
          iVar9 = iVar10;
        }
        uVar8 = 0xff;
        iVar19 = iVar19 - iVar12;
        *(bool *)(lVar18 + -1 + lVar26 * 4) = iVar19 == 0;
        *(short *)(lVar18 + -4 + lVar26 * 4) = (short)iVar9 + (short)iVar5;
        if (iVar19 != 0) {
          iVar10 = get_hist_bin_idx(iVar19,iVar10);
          uVar8 = (undefined1)iVar10;
        }
        *(undefined1 *)(lVar18 + -2 + lVar26 * 4) = uVar8;
      }
      lVar18 = lVar18 + (ulong)bVar6 * 4;
      lVar17 = lVar17 + lVar25;
      lVar24 = lVar24 + lVar25;
    }
  }
  return;
}

Assistant:

static inline void compute_gradient_info_sb(MACROBLOCK *const x,
                                            BLOCK_SIZE sb_size,
                                            PLANE_TYPE plane) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(&x->e_mbd)) {
    highbd_compute_gradient_info_sb(x, sb_size, plane);
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  lowbd_compute_gradient_info_sb(x, sb_size, plane);
}